

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook-inl.h
# Opt level: O0

bool __thiscall
base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::empty
          (HookList<void_(*)(const_void_*,_unsigned_long)> *this)

{
  HookList<void_(*)(const_void_*,_unsigned_long)> *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->priv_end).super___atomic_base<unsigned_long>._M_i == 0;
}

Assistant:

bool empty() const {
    return priv_end.load(std::memory_order_relaxed) == 0;
  }